

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O0

void __thiscall synth_state::run<short>(synth_state *this,short *audiobuffer,long nframes)

{
  float fVar1;
  short sVar2;
  long in_RDX;
  undefined2 in_SI;
  undefined6 in_register_00000032;
  int *in_RDI;
  float fVar3;
  double dVar4;
  long n;
  float phase_inc;
  float freq;
  int c;
  long local_30;
  int local_1c;
  
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    fVar3 = get_frequency(local_1c);
    fVar1 = (float)in_RDI[0x21];
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      dVar4 = std::sin((double)(ulong)(uint)in_RDI[(long)local_1c + 1]);
      sVar2 = ConvertSample<short>((double)SUB84(dVar4,0) * 0.2);
      *(short *)(CONCAT62(in_register_00000032,in_SI) + (local_30 * *in_RDI + (long)local_1c) * 2) =
           sVar2;
      in_RDI[(long)local_1c + 1] =
           (int)((fVar3 * 6.2831855) / fVar1 + (float)in_RDI[(long)local_1c + 1]);
    }
  }
  return;
}

Assistant:

void run(T* audiobuffer, long nframes)
    {
      for(int c=0;c < num_channels;++c) {
        float freq = get_frequency(c);
        float phase_inc = 2.0 * M_PI * freq / sample_rate;
        for(long n=0;n < nframes;++n) {
          audiobuffer[n*num_channels+c] = ConvertSample<T>(sin(phase[c]) * VOLUME);
          phase[c] += phase_inc;
        }
      }
    }